

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::
Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doGetUsedFuncs(Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *this,FuncSet *dst)

{
  Expr<tcu::Matrix<float,_4,_3>_> *pEVar1;
  Expr<vkt::shaderexecutor::Void> *pEVar2;
  
  (**(code **)(*(long *)this->m_func + 0x38))();
  pEVar1 = (this->m_args).a.super_ContainerExprPBase<tcu::Matrix<float,_4,_3>_>.
           super_ExprPBase<tcu::Matrix<float,_4,_3>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_>.m_ptr;
  (*(pEVar1->super_ExprBase)._vptr_ExprBase[3])(pEVar1,dst);
  pEVar1 = (this->m_args).b.super_ContainerExprPBase<tcu::Matrix<float,_4,_3>_>.
           super_ExprPBase<tcu::Matrix<float,_4,_3>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_>.m_ptr;
  (*(pEVar1->super_ExprBase)._vptr_ExprBase[3])(pEVar1,dst);
  pEVar2 = (this->m_args).c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
           super_ExprPBase<vkt::shaderexecutor::Void>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[3])(pEVar2,dst);
  pEVar2 = (this->m_args).d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
           super_ExprPBase<vkt::shaderexecutor::Void>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[3])(pEVar2,dst);
  return;
}

Assistant:

void				doGetUsedFuncs	(FuncSet& dst) const
	{
		m_func.getUsedFuncs(dst);
		m_args.a->getUsedFuncs(dst);
		m_args.b->getUsedFuncs(dst);
		m_args.c->getUsedFuncs(dst);
		m_args.d->getUsedFuncs(dst);
	}